

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Reference __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
::DoReadReference(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *this)

{
  int iVar1;
  Reference RVar2;
  undefined8 *in_RDI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *unaff_retaddr;
  int index;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = ReadUInt(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  if (iVar1 < *(int *)in_RDI[1]) {
    RVar2 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnVariableRef
                      ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  else {
    RVar2 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnCommonExprRef
                      ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  return RVar2;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }